

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O1

void density::f_copy_construct::invoke<density_tests::Derived1>(void *i_dest,void *i_source)

{
  long lVar1;
  
  lVar1 = *(long *)(*i_source + -0x18);
  *(undefined4 *)((long)i_dest + 0x20) = *(undefined4 *)((long)i_source + lVar1 + 8);
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0x24));
  *(undefined ***)((long)i_dest + 0x18) = &PTR_class_id_010792f8;
  *(undefined8 *)((long)i_dest + 0x28) = *(undefined8 *)((long)i_source + lVar1 + 0x10);
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0x30));
  *(undefined8 *)i_dest = 0x1079430;
  *(undefined8 *)((long)i_dest + 0x18) = 0x1079468;
  *(undefined8 *)((long)i_dest + 8) = *(undefined8 *)((long)i_source + 8);
  density_tests::InstanceCounted::new_instance((InstanceCounted *)((long)i_dest + 0x10));
  return;
}

Assistant:

constexpr f_copy_construct(Function i_function) : m_function(i_function) {}